

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointRecord2.cpp
# Opt level: O0

KDataStream * __thiscall
KDIS::DATA_TYPE::PointRecord2::Encode(KDataStream *__return_storage_ptr__,PointRecord2 *this)

{
  PointRecord2 *this_local;
  KDataStream *stream;
  
  KDataStream::KDataStream(__return_storage_ptr__,Big_Endian);
  Encode(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

KDataStream PointRecord2::Encode() const
{
    KDataStream stream;

    PointRecord2::Encode( stream );

    return stream;
}